

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandBmc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint fRewrite;
  uint fVerbose;
  uint uVar2;
  uint fNewAlgo;
  uint fUseSatoko;
  int iVar3;
  Abc_Ntk_t *pNtk;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  uint local_8c;
  uint local_88;
  uint local_84;
  ulong local_68;
  char *local_60;
  ulong local_50;
  int iFrames;
  undefined4 extraout_var;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_68 = 0;
  Extra_UtilGetoptReset();
  fNewAlgo = 1;
  local_84 = 1000;
  local_88 = 100000;
  local_8c = 0x14;
  local_50 = 0;
  fRewrite = 0;
  fVerbose = 0;
  fUseSatoko = 0;
  local_60 = (char *)0x0;
LAB_0026f57c:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"FNCGDLrsvh"), iVar3 = globalUtilOptind, 0x60 < iVar1) {
    if (iVar1 < 0x73) {
      if (iVar1 == 0x61) {
        fNewAlgo = fNewAlgo ^ 1;
      }
      else {
        if (iVar1 != 0x72) goto switchD_0026f5a2_caseD_45;
        fRewrite = fRewrite ^ 1;
      }
    }
    else if (iVar1 == 0x73) {
      fUseSatoko = fUseSatoko ^ 1;
    }
    else {
      if (iVar1 != 0x76) goto switchD_0026f5a2_caseD_45;
      fVerbose = fVerbose ^ 1;
    }
  }
  switch(iVar1) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
      break;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    uVar4 = CONCAT44(extraout_var,iVar1);
    local_68 = uVar4;
LAB_0026f6d6:
    uVar2 = (uint)uVar4;
joined_r0x0026f6a7:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
switchD_0026f5a2_caseD_45:
      Abc_Print(-2,"usage: bmc [-FNC num] [-L file] [-rcsvh]\n");
      Abc_Print(-2,"\t         performs bounded model checking with static unrolling\n");
      Abc_Print(-2,"\t-F num : the number of time frames [default = %d]\n",(ulong)local_8c);
      Abc_Print(-2,"\t-N num : the max number of nodes in the frames [default = %d]\n",
                (ulong)local_88);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",local_68);
      pcVar6 = "no logging";
      if (local_60 != (char *)0x0) {
        pcVar6 = local_60;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",pcVar6);
      pcVar5 = "yes";
      pcVar6 = "yes";
      if (fRewrite == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle the use of rewriting [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (fUseSatoko == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle using Satoko by Bruno Schmitt [default = %s]\n",pcVar6);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
      pcVar6 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_0026f8b2:
      Abc_Print(iVar3,pcVar6);
      return 1;
    }
    goto LAB_0026f57c;
  case 0x44:
    if (globalUtilOptind < argc) {
      local_84 = atoi(argv[globalUtilOptind]);
      uVar2 = local_84;
      goto joined_r0x0026f6a7;
    }
    pcVar6 = "Command line switch \"-D\" should be followed by an integer.\n";
    break;
  case 0x45:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
    goto switchD_0026f5a2_caseD_45;
  case 0x46:
    if (globalUtilOptind < argc) {
      local_8c = atoi(argv[globalUtilOptind]);
      uVar2 = local_8c;
      goto joined_r0x0026f6a7;
    }
    pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      uVar4 = (ulong)uVar2;
      local_50 = uVar4;
      goto LAB_0026f6d6;
    }
    pcVar6 = "Command line switch \"-G\" should be followed by an integer.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      local_60 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0026f57c;
    }
    pcVar6 = "Command line switch \"-L\" should be followed by a file name.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      local_88 = atoi(argv[globalUtilOptind]);
      uVar2 = local_88;
      goto joined_r0x0026f6a7;
    }
    pcVar6 = "Command line switch \"-N\" should be followed by an integer.\n";
    break;
  default:
    if (iVar1 == -1) {
      if (pNtk != (Abc_Ntk_t *)0x0) {
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          if (pNtk->nObjCounts[8] != 0) {
            if ((pAbc->fBatchMode == 0) || (1 < (uint)pAbc->Status)) {
              iVar3 = Abc_NtkDarBmc(pNtk,0,local_8c,local_88,local_84,0,(int)local_68,(int)local_50,
                                    fRewrite,fNewAlgo,0,0,fVerbose,&iFrames,fUseSatoko);
              pAbc->Status = iVar3;
              pAbc->nFrames = iFrames;
              Abc_FrameReplaceCex(pAbc,&pNtk->pSeqModel);
              if (local_60 == (char *)0x0) {
                return 0;
              }
              Abc_NtkWriteLogFile(local_60,pAbc->pCex,pAbc->Status,pAbc->nFrames,"bmc");
              return 0;
            }
            pcVar6 = "The miters is already solved; skipping the command.\n";
            iVar3 = 1;
            goto LAB_0026f996;
          }
          pcVar6 = "Does not work for combinational networks.\n";
        }
        else {
          pcVar6 = "Currently only works for structurally hashed circuits.\n";
        }
        iVar3 = -1;
LAB_0026f996:
        Abc_Print(iVar3,pcVar6);
        return 0;
      }
      pcVar6 = "Empty network.\n";
      iVar3 = -1;
      goto LAB_0026f8b2;
    }
    goto switchD_0026f5a2_caseD_45;
  }
  Abc_Print(-1,pcVar6);
  goto switchD_0026f5a2_caseD_45;
}

Assistant:

int Abc_CommandBmc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int nFrames;
    int nSizeMax;
    int nBTLimit;
    int nBTLimitAll;
    int nNodeDelta;
    int fRewrite;
    int fNewAlgo;
    int nCofFanLit;
    int fVerbose;
    int iFrames;
    int fUseSatoko;
    char * pLogFileName = NULL;

    extern int Abc_NtkDarBmc( Abc_Ntk_t * pNtk, int nStart, int nFrames, int nSizeMax, int nNodeDelta, int nTimeOut, int nBTLimit, int nBTLimitAll, int fRewrite, int fNewAlgo, int fOrDecomp, int nCofFanLit, int fVerbose, int * piFrames, int fUseSatoko );
    // set defaults
    nFrames     =       20;
    nSizeMax    =   100000;
    nBTLimit    =        0;
    nBTLimitAll =        0;
    nNodeDelta  =     1000;
    fRewrite    =        0;
    fNewAlgo    =        1;
    nCofFanLit  =        0;
    fVerbose    =        0;
    fUseSatoko  =        0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FNCGDLrsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSizeMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimit < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimitAll = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimitAll < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodeDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodeDelta < 0 )
                goto usage;
            break;
/*
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nCofFanLit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCofFanLit < 0 )
                goto usage;
            break;
*/
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'r':
            fRewrite ^= 1;
            break;
        case 'a':
            fNewAlgo ^= 1;
            break;
        case 's':
            fUseSatoko ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( -1, "Does not work for combinational networks.\n" );
        return 0;
    }
    if ( pAbc->fBatchMode && (pAbc->Status == 0 || pAbc->Status == 1) ) 
    { 
        Abc_Print( 1, "The miters is already solved; skipping the command.\n" ); 
        return 0;
    }
    pAbc->Status = Abc_NtkDarBmc( pNtk, 0, nFrames, nSizeMax, nNodeDelta, 0, nBTLimit, nBTLimitAll, fRewrite, fNewAlgo, 0, nCofFanLit, fVerbose, &iFrames, fUseSatoko );
    pAbc->nFrames = iFrames;
    Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "bmc" );
    return 0;

usage:
    Abc_Print( -2, "usage: bmc [-FNC num] [-L file] [-rcsvh]\n" );
    Abc_Print( -2, "\t         performs bounded model checking with static unrolling\n" );
    Abc_Print( -2, "\t-F num : the number of time frames [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-N num : the max number of nodes in the frames [default = %d]\n", nSizeMax );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", nBTLimit );
//    Abc_Print( -2, "\t-L num : the limit on fanout count of resets/enables to cofactor [default = %d]\n", nCofFanLit );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-r     : toggle the use of rewriting [default = %s]\n", fRewrite? "yes": "no" );
//    Abc_Print( -2, "\t-a     : toggle SAT sweeping and SAT solving [default = %s]\n", fNewAlgo? "SAT solving": "SAT sweeping" );
    Abc_Print( -2, "\t-s     : toggle using Satoko by Bruno Schmitt [default = %s]\n", fUseSatoko? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}